

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int AF__FTranslatedLineTarget_TraceBleed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int damage;
  FTranslatedLineTarget *t;
  bool bVar1;
  char *pcVar2;
  AActor *puff;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
LAB_0041ea2e:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b0,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
    pcVar2 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_0041ea2e;
  }
  if (numparam == 1) {
    pcVar2 = "(paramnum) < numparam";
LAB_0041ea56:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b1,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar2 = "param[paramnum].Type == REGT_INT";
    goto LAB_0041ea56;
  }
  if ((uint)numparam < 3) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_0041ea75;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_0041ea15:
    pcVar2 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0041ea75;
  }
  t = (FTranslatedLineTarget *)(param->field_0).field_1.a;
  damage = param[1].field_0.i;
  puff = (AActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (puff == (AActor *)0x0) goto LAB_0041e9c4;
  }
  else {
    if (puff != (AActor *)0x0) goto LAB_0041ea15;
LAB_0041e9c4:
    NullParam("\"missile\"");
    puff = (AActor *)param[2].field_0.field_1.a;
    if (puff == (AActor *)0x0) {
      puff = (AActor *)0x0;
      goto LAB_0041e9fb;
    }
  }
  bVar1 = DObject::IsKindOf((DObject *)puff,AActor::RegistrationInfo.MyClass);
  if (!bVar1) {
    pcVar2 = "missile == NULL || missile->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0041ea75:
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x12b2,
                  "int AF__FTranslatedLineTarget_TraceBleed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_0041e9fb:
  P_TraceBleed(damage,t,puff);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(_FTranslatedLineTarget, TraceBleed)
{
	PARAM_SELF_STRUCT_PROLOGUE(FTranslatedLineTarget);
	PARAM_INT(damage);
	PARAM_OBJECT_NOT_NULL(missile, AActor);

	P_TraceBleed(damage, self, missile);
	return 0;
}